

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_copy(archive *a,la_zstream *lastrm,la_zaction action)

{
  int in_EDX;
  long *in_RSI;
  size_t bytes;
  size_t local_28;
  int local_4;
  
  if ((ulong)in_RSI[1] < (ulong)in_RSI[4]) {
    local_28 = in_RSI[1];
  }
  else {
    local_28 = in_RSI[4];
  }
  if (local_28 != 0) {
    memcpy((void *)in_RSI[3],(void *)*in_RSI,local_28);
    *in_RSI = local_28 + *in_RSI;
    in_RSI[1] = in_RSI[1] - local_28;
    in_RSI[2] = local_28 + in_RSI[2];
    in_RSI[3] = local_28 + in_RSI[3];
    in_RSI[4] = in_RSI[4] - local_28;
    in_RSI[5] = local_28 + in_RSI[5];
  }
  if ((in_EDX == 0) && (in_RSI[1] == 0)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
compression_code_copy(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	size_t bytes;

	(void)a; /* UNUSED */
	if (lastrm->avail_out > lastrm->avail_in)
		bytes = lastrm->avail_in;
	else
		bytes = lastrm->avail_out;
	if (bytes) {
		memcpy(lastrm->next_out, lastrm->next_in, bytes);
		lastrm->next_in += bytes;
		lastrm->avail_in -= bytes;
		lastrm->total_in += bytes;
		lastrm->next_out += bytes;
		lastrm->avail_out -= bytes;
		lastrm->total_out += bytes;
	}
	if (action == ARCHIVE_Z_FINISH && lastrm->avail_in == 0)
		return (ARCHIVE_EOF);
	return (ARCHIVE_OK);
}